

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

void ui_visuals_module_init(void)

{
  anon_struct_24_3_6ed953bc *paVar1;
  errr eVar2;
  visuals_flicker *p;
  uint8_t *puVar3;
  
  event_signal_message(EVENT_INITSTATUS,L'\0',"Initializing visuals");
  p = (visuals_flicker *)mem_zalloc(0x18);
  if (p != (visuals_flicker *)0x0) {
    puVar3 = (uint8_t *)mem_zalloc(0x60);
    p->cycles = puVar3;
    if (puVar3 != (uint8_t *)0x0) {
      p->max_cycles = 0x20;
      p->colors_per_cycle = 3;
      goto LAB_001f28ea;
    }
    mem_free(p);
  }
  p = (visuals_flicker *)0x0;
LAB_001f28ea:
  visuals_flicker_table = p;
  if (p == (visuals_flicker *)0x0) {
    quit("Unable to allocate flicker table");
  }
  visuals_color_cycles_by_race = (anon_struct_24_3_6ed953bc *)mem_zalloc(0x18);
  if (visuals_color_cycles_by_race == (anon_struct_24_3_6ed953bc *)0x0) {
    quit("Unable to allocate race/color cycle table");
  }
  paVar1 = visuals_color_cycles_by_race;
  visuals_color_cycles_by_race->max_entries = 0;
  paVar1->alloc_size = 100;
  eVar2 = run_parser(&visuals_file_parser);
  if (eVar2 != 0) {
    quit("Cannot initialize visuals");
  }
  if (visuals_file_parser.cleanup != (_func_void *)0x0) {
    (*visuals_file_parser.cleanup)();
    return;
  }
  return;
}

Assistant:

static void ui_visuals_module_init(void)
{
	event_signal_message(EVENT_INITSTATUS, 0, "Initializing visuals");

	/* Use the same values as the legacy flicker table. */
	visuals_flicker_table = visuals_flicker_new(MAX_COLORS, 3);

	if (visuals_flicker_table == NULL) {
		quit("Unable to allocate flicker table");
	}

	/* Allocate a lookup table for race to color cycles. */
	visuals_color_cycles_by_race = mem_zalloc(sizeof(*visuals_color_cycles_by_race));

	if (visuals_color_cycles_by_race == NULL) {
		quit("Unable to allocate race/color cycle table");
	}

	/* At this point, we don't know how many entries we'll need, so the table
	 * will be resized dynamically. */
	visuals_color_cycles_by_race->max_entries = 0;
	visuals_color_cycles_by_race->alloc_size = 100;

	/* Parsing will result in the cycler table being set up. */
	if (run_parser(&visuals_file_parser)) {
		quit("Cannot initialize visuals");
	}

	if (visuals_file_parser.cleanup) {
		visuals_file_parser.cleanup();
	}
}